

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O1

int coda_expression_eval_string(coda_expression *expr,coda_cursor *cursor,char **value,long *length)

{
  size_t __n;
  char *__ptr;
  int iVar1;
  char *pcVar2;
  long offset;
  eval_info info;
  long local_378;
  eval_info local_370;
  
  if (expr->result_type == coda_expression_string) {
    local_370.orig_cursor = cursor;
    if (cursor == (coda_cursor *)0x0) {
      if (expr->is_constant == 0) {
        pcVar2 = "cursor argument may not be NULL if expression is not constant";
        goto LAB_00112a03;
      }
    }
    else {
      memcpy(&local_370.cursor,cursor,0x310);
    }
    local_370.index[2] = 0;
    local_370.variable_index = 0;
    local_370.index[0] = 0;
    local_370.index[1] = 0;
    local_370.variable_name = (char *)0x0;
    iVar1 = eval_string(&local_370,expr,&local_378,length,value);
    if (iVar1 != 0) {
      if (cursor == (coda_cursor *)0x0) {
        return -1;
      }
      iVar1 = coda_cursor_compare(cursor,&local_370.cursor);
      if (iVar1 == 0) {
        return -1;
      }
      coda_cursor_add_to_error_message(&local_370.cursor);
      return -1;
    }
    __n = *length;
    if ((long)__n < 1) {
      if (*value != (char *)0x0) {
        free(*value);
      }
      *value = (char *)0x0;
    }
    else {
      if (local_378 != 0) {
        pcVar2 = (char *)malloc(__n + 1);
        if (pcVar2 == (char *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %ld bytes) (%s:%u)",__n,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                         ,0x14cb);
          goto LAB_00112a0f;
        }
        __ptr = *value;
        memcpy(pcVar2,__ptr + local_378,__n);
        free(__ptr);
        *value = pcVar2;
      }
      (*value)[*length] = '\0';
    }
    iVar1 = 0;
  }
  else {
    pcVar2 = "expression is not a \'string\' expression";
LAB_00112a03:
    coda_set_error(-100,pcVar2);
LAB_00112a0f:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

LIBCODA_API int coda_expression_eval_string(const coda_expression *expr, const coda_cursor *cursor, char **value,
                                            long *length)
{
    eval_info info;
    long offset;

    if (expr->result_type != coda_expression_string)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not a 'string' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    if (eval_string(&info, expr, &offset, length, value) != 0)
    {
        if (cursor != NULL && coda_cursor_compare(cursor, &info.cursor) != 0)
        {
            coda_cursor_add_to_error_message(&info.cursor);
        }
        return -1;
    }

    if (*length > 0)
    {
        if (offset != 0)
        {
            char *truncated_value;

            truncated_value = malloc(*length + 1);
            if (truncated_value == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %ld bytes) (%s:%u)",
                               *length, __FILE__, __LINE__);
                return -1;
            }
            memcpy(truncated_value, &(*value)[offset], *length);
            free(*value);
            *value = truncated_value;
        }
        (*value)[*length] = '\0';
    }
    else
    {
        if (*value != NULL)
        {
            free(*value);
        }
        *value = NULL;
    }

    return 0;
}